

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

void __thiscall
OpenMD::SelectionEvaluator::withinInstruction
          (SelectionEvaluator *this,Token *instruction,SelectionSet *bs)

{
  _func_void__Op_any_ptr__Arg_ptr *p_Var1;
  char *pcVar2;
  int iVar3;
  type_info *ptVar4;
  float *pfVar5;
  int *piVar6;
  float fVar7;
  any withinSpec;
  _Arg __arg;
  any local_68;
  _Arg local_58;
  pointer pOStack_50;
  pointer local_48 [2];
  SelectionSet local_38;
  
  local_68._M_storage._M_ptr = (void *)0x0;
  p_Var1 = (instruction->value)._M_manager;
  if (p_Var1 == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    local_68._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  else {
    local_58._M_obj = &local_68;
    (*p_Var1)(_Op_clone,&instruction->value,&local_58);
  }
  ptVar4 = std::any::type(&local_68);
  pcVar2 = *(char **)(ptVar4 + 8);
  if (pcVar2 == _seekoff) {
LAB_0020289f:
    pfVar5 = (float *)std::__any_caster<float>(&local_68);
    if (pfVar5 == (float *)0x0) goto LAB_00202960;
    fVar7 = *pfVar5;
    goto LAB_002028cb;
  }
  if (*pcVar2 != '*') {
    iVar3 = strcmp(pcVar2,_seekoff);
    if (iVar3 == 0) goto LAB_0020289f;
  }
  ptVar4 = std::any::type(&local_68);
  pcVar2 = *(char **)(ptVar4 + 8);
  if (pcVar2 == _put) {
LAB_002028b6:
    piVar6 = (int *)std::__any_caster<int>(&local_68);
    if (piVar6 == (int *)0x0) {
LAB_00202960:
      std::__throw_bad_any_cast();
    }
    fVar7 = (float)*piVar6;
  }
  else {
    if (*pcVar2 != '*') {
      iVar3 = strcmp(pcVar2,_put);
      if (iVar3 == 0) goto LAB_002028b6;
    }
    local_58._M_obj = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"casting error in withinInstruction","");
    snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n",local_58._M_obj);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((pointer *)local_58._M_obj != local_48) {
      operator_delete(local_58._M_obj,(long)local_48[0] + 1);
    }
    SelectionSet::clearAll(bs);
    fVar7 = 0.0;
  }
LAB_002028cb:
  DistanceFinder::find(&local_38,&this->distanceFinder,bs,(double)fVar7);
  local_58 = (_Arg)(bs->bitsets_).
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  pOStack_50 = (bs->bitsets_).
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  local_48[0] = (bs->bitsets_).
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  (bs->bitsets_).super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_38.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_start;
  (bs->bitsets_).super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_38.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (bs->bitsets_).super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_38.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_58);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_38.bitsets_);
  if (local_68._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68._M_manager)(_Op_destroy,&local_68,(_Arg *)0x0);
  }
  return;
}

Assistant:

void SelectionEvaluator::withinInstruction(const Token& instruction,
                                             SelectionSet& bs) {
    std::any withinSpec = instruction.value;
    float distance(0.0);
    if (withinSpec.type() == typeid(float)) {
      distance = std::any_cast<float>(withinSpec);
    } else if (withinSpec.type() == typeid(int)) {
      distance = std::any_cast<int>(withinSpec);
    } else {
      evalError("casting error in withinInstruction");
      bs.clearAll();
    }

    bs = distanceFinder.find(bs, distance);
  }